

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_delete(char *_fname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr *p_Var2;
  DirHandle *pDVar3;
  ulong *puVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong *puVar8;
  ulong *puVar9;
  PHYSFS_ErrorCode errcode;
  bool bVar10;
  ulong uStack_38;
  ulong *local_30;
  
  puVar9 = &uStack_38;
  if (_fname == (char *)0x0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    sVar7 = strlen(_fname);
    if (sVar7 + 1 < 0x100) {
      puVar8 = (ulong *)((long)&uStack_38 - (sVar7 + 0x18 & 0xfffffffffffffff0));
      puVar9 = puVar8;
    }
    else {
      puVar8 = (ulong *)0x0;
      puVar9 = &uStack_38;
    }
    bVar10 = puVar8 == (ulong *)0x0;
    if (bVar10) {
      puVar9[-1] = 0x10872c;
      puVar8 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar7 + 9);
    }
    if (puVar8 == (ulong *)0x0) {
      puVar8 = (ulong *)0x0;
    }
    else {
      *puVar8 = (ulong)bVar10;
      puVar8 = puVar8 + 1;
    }
    if (puVar8 != (ulong *)0x0) {
      local_30 = puVar8;
      puVar9[-1] = 0x108756;
      iVar5 = sanitizePlatformIndependentPath(_fname,(char *)puVar8);
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else {
        puVar9[-1] = 0x108766;
        __PHYSFS_platformGrabMutex(stateLock);
        pDVar3 = writeDir;
        if (writeDir == (DirHandle *)0x0) {
          puVar9[-1] = 0x1087b8;
          PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
          iVar5 = 0;
        }
        else {
          iVar5 = 0;
          puVar9[-1] = 0x108783;
          iVar6 = verifyPath(writeDir,(char **)&local_30,0);
          puVar4 = local_30;
          if (iVar6 != 0) {
            pvVar1 = pDVar3->opaque;
            p_Var2 = pDVar3->funcs->remove;
            puVar9[-1] = 0x108795;
            iVar5 = (*p_Var2)(pvVar1,(char *)puVar4);
          }
        }
        puVar9[-1] = 0x1087c7;
        __PHYSFS_platformReleaseMutex(stateLock);
      }
      if (puVar8[-1] == 0) {
        return iVar5;
      }
      puVar9[-1] = 0x1087db;
      (*__PHYSFS_AllocatorHooks.Free)(puVar8 + -1);
      return iVar5;
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  *(undefined8 *)((long)puVar9 + -8) = 0x1087a4;
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

int PHYSFS_delete(const char *_fname)
{
    int retval;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doDelete(_fname, fname);
    __PHYSFS_smallFree(fname);
    return retval;
}